

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_for_loop(jit_State *J,BCIns *fori,ScEvEntry *scev,int init)

{
  TValue *pTVar1;
  uint uVar2;
  IRType t_00;
  TRef mode_00;
  int iVar3;
  TRef TVar4;
  uint uVar5;
  int in_ECX;
  undefined4 *in_RDX;
  uint *in_RSI;
  jit_State *in_RDI;
  int dir;
  int tc;
  TRef step;
  TRef stop;
  int mode;
  IRType t;
  TRef idx;
  cTValue *tv;
  BCReg ra;
  int in_stack_ffffffffffffff9c;
  IRType in_stack_ffffffffffffffa0;
  IRType in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  IRType IVar6;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  BCReg slot;
  IRType IVar7;
  undefined4 uVar8;
  undefined2 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff2;
  undefined2 in_stack_fffffffffffffff4;
  undefined2 in_stack_fffffffffffffff6;
  
  uVar2 = *in_RSI >> 8 & 0xff;
  pTVar1 = in_RDI->L->base;
  uVar5 = in_RDI->base[uVar2];
  if (uVar5 == 0) {
    if (in_ECX == 0) {
      in_stack_ffffffffffffffa4 = IRT_NUM;
      IVar6 = in_stack_ffffffffffffffa4;
    }
    else {
      in_stack_ffffffffffffffa4 =
           lj_opt_narrow_forl((jit_State *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              (cTValue *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      IVar6 = in_stack_ffffffffffffffa4;
    }
  }
  else {
    IVar6 = uVar5 >> 0x18 & IRT_TYPE;
  }
  slot = 0x30;
  IVar7 = IVar6;
  t_00 = fori_arg((jit_State *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  (BCIns *)CONCAT44(in_stack_ffffffffffffffac,IVar6),in_stack_ffffffffffffffa4,
                  in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  mode_00 = fori_arg((jit_State *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (BCIns *)CONCAT44(in_stack_ffffffffffffffac,IVar6),in_stack_ffffffffffffffa4,
                     in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  iVar3 = rec_for_direction(pTVar1 + (ulong)uVar2 + 2);
  *(char *)(in_RDX + 3) = (char)IVar7;
  *(char *)((long)in_RDX + 0xd) = (char)iVar3;
  *(short *)(in_RDX + 2) = (short)t_00;
  *(short *)((long)in_RDX + 10) = (short)mode_00;
  rec_for_check((jit_State *)
                CONCAT26(in_stack_fffffffffffffff6,
                         CONCAT24(in_stack_fffffffffffffff4,
                                  CONCAT22(in_stack_fffffffffffffff2,in_stack_fffffffffffffff0))),
                (IRType)((ulong)in_RDI >> 0x20),(int)in_RDI,(TRef)((ulong)in_RSI >> 0x20),
                (TRef)in_RSI,(int)((ulong)in_RDX >> 0x20));
  TVar4 = find_kinit(in_RDI,in_RSI,(BCReg)((ulong)in_RDX >> 0x20),(IRType)in_RDX);
  uVar8 = SUB84(in_RSI,0);
  *(short *)((long)in_RDX + 6) = (short)TVar4;
  if (uVar5 == 0) {
    uVar5 = fori_load((jit_State *)(ulong)IVar7,slot,t_00,mode_00);
  }
  if (in_ECX == 0) {
    (in_RDI->fold).ins.field_0.ot = (ushort)IVar7 | 0x2900;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)uVar5;
    (in_RDI->fold).ins.field_0.op2 = (IRRef1)mode_00;
    uVar5 = lj_opt_fold((jit_State *)CONCAT44(iVar3,IVar6));
    in_RDI->base[uVar2] = uVar5;
  }
  in_RDI->base[uVar2 + 3] = uVar5;
  *(short *)(in_RDX + 1) = (short)uVar5;
  *in_RDX = uVar8;
  in_RDI->maxslot = uVar2 + 4;
  return;
}

Assistant:

static void rec_for_loop(jit_State *J, const BCIns *fori, ScEvEntry *scev,
			 int init)
{
  BCReg ra = bc_a(*fori);
  cTValue *tv = &J->L->base[ra];
  TRef idx = J->base[ra+FORL_IDX];
  IRType t = idx ? tref_type(idx) :
	     (init || LJ_DUALNUM) ? lj_opt_narrow_forl(J, tv) : IRT_NUM;
  int mode = IRSLOAD_INHERIT +
    ((!LJ_DUALNUM || tvisint(tv) == (t == IRT_INT)) ? IRSLOAD_READONLY : 0);
  TRef stop = fori_arg(J, fori, ra+FORL_STOP, t, mode);
  TRef step = fori_arg(J, fori, ra+FORL_STEP, t, mode);
  int tc, dir = rec_for_direction(&tv[FORL_STEP]);
  lj_assertJ(bc_op(*fori) == BC_FORI || bc_op(*fori) == BC_JFORI,
	     "bad bytecode %d instead of FORI/JFORI", bc_op(*fori));
  scev->t.irt = t;
  scev->dir = dir;
  scev->stop = tref_ref(stop);
  scev->step = tref_ref(step);
  rec_for_check(J, t, dir, stop, step, init);
  scev->start = tref_ref(find_kinit(J, fori, ra+FORL_IDX, IRT_INT));
  tc = (LJ_DUALNUM &&
	!(scev->start && irref_isk(scev->stop) && irref_isk(scev->step) &&
	  tvisint(&tv[FORL_IDX]) == (t == IRT_INT))) ?
	IRSLOAD_TYPECHECK : 0;
  if (tc) {
    J->base[ra+FORL_STOP] = stop;
    J->base[ra+FORL_STEP] = step;
  }
  if (!idx)
    idx = fori_load(J, ra+FORL_IDX, t,
		    IRSLOAD_INHERIT + tc + (J->scev.start << 16));
  if (!init)
    J->base[ra+FORL_IDX] = idx = emitir(IRT(IR_ADD, t), idx, step);
  J->base[ra+FORL_EXT] = idx;
  scev->idx = tref_ref(idx);
  setmref(scev->pc, fori);
  J->maxslot = ra+FORL_EXT+1;
}